

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O2

void cuddShrinkDeathRow(DdManager *table)

{
  uint uVar1;
  int iVar2;
  DdNode **ppDVar3;
  ulong uVar4;
  
  uVar1 = table->deathRowDepth;
  if (3 < (int)uVar1) {
    for (uVar4 = (ulong)(uVar1 >> 2);
        ((long)uVar4 < (long)(int)uVar1 && (table->deathRow[uVar4] != (DdNode *)0x0));
        uVar4 = uVar4 + 1) {
      Cudd_IterDerefBdd(table,table->deathRow[uVar4]);
      table->deathRow[uVar4] = (DdNode *)0x0;
      uVar1 = table->deathRowDepth;
    }
    iVar2 = (int)uVar1 / 4;
    table->deathRowDepth = iVar2;
    table->deadMask = iVar2 - 1U;
    if (iVar2 - 1U < (uint)table->nextDead) {
      table->nextDead = 0;
    }
    if (table->deathRow == (DdNode **)0x0) {
      ppDVar3 = (DdNode **)malloc((long)iVar2 << 3);
    }
    else {
      ppDVar3 = (DdNode **)realloc(table->deathRow,(long)iVar2 << 3);
    }
    table->deathRow = ppDVar3;
  }
  return;
}

Assistant:

void
cuddShrinkDeathRow(
  DdManager *table)
{
#ifndef DD_NO_DEATH_ROW
    int i;

    if (table->deathRowDepth > 3) {
        for (i = table->deathRowDepth/4; i < table->deathRowDepth; i++) {
            if (table->deathRow[i] == NULL) break;
            Cudd_IterDerefBdd(table,table->deathRow[i]);
            table->deathRow[i] = NULL;
        }
        table->deathRowDepth /= 4;
        table->deadMask = table->deathRowDepth - 1;
        if ((unsigned) table->nextDead > table->deadMask) {
            table->nextDead = 0;
        }
        table->deathRow = ABC_REALLOC(DdNodePtr, table->deathRow,
                                   table->deathRowDepth);
    }
#endif

}